

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.h
# Opt level: O0

int secp256k1_musig_secnonce_load
              (secp256k1_context *ctx,secp256k1_scalar *k,secp256k1_ge *pk,
              secp256k1_musig_secnonce *secnonce)

{
  int iVar1;
  uchar *in_RCX;
  secp256k1_scalar *in_RDX;
  secp256k1_context *in_RDI;
  uchar *in_stack_00000008;
  int is_zero;
  char *in_stack_ffffffffffffffc8;
  uint in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  int local_4;
  
  iVar1 = secp256k1_memcmp_var(in_RCX,secp256k1_musig_secnonce_magic,4);
  if (iVar1 == 0) {
    iVar1 = secp256k1_is_zero_array((uchar *)in_RDX,(size_t)in_RCX);
    secp256k1_declassify(in_RDI,&stack0xffffffffffffffd4,4);
    if (iVar1 == 0) {
      secp256k1_scalar_set_b32(in_RDX,in_RCX,(int *)(ulong)in_stack_ffffffffffffffd0);
      secp256k1_scalar_set_b32(in_RDX,in_RCX,(int *)CONCAT44(iVar1,in_stack_ffffffffffffffd0));
      secp256k1_ge_from_bytes((secp256k1_ge *)secnonce,in_stack_00000008);
      local_4 = 1;
    }
    else {
      secp256k1_callback_call
                ((secp256k1_callback *)CONCAT44(iVar1,in_stack_ffffffffffffffd0),
                 in_stack_ffffffffffffffc8);
      local_4 = 0;
    }
  }
  else {
    secp256k1_callback_call
              ((secp256k1_callback *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
               in_stack_ffffffffffffffc8);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int secp256k1_musig_secnonce_load(const secp256k1_context* ctx, secp256k1_scalar *k, secp256k1_ge *pk, const secp256k1_musig_secnonce *secnonce) {
    int is_zero;
    ARG_CHECK(secp256k1_memcmp_var(&secnonce->data[0], secp256k1_musig_secnonce_magic, 4) == 0);
    /* We make very sure that the nonce isn't invalidated by checking the values
     * in addition to the magic. */
    is_zero = secp256k1_is_zero_array(&secnonce->data[4], 2 * 32);
    secp256k1_declassify(ctx, &is_zero, sizeof(is_zero));
    ARG_CHECK(!is_zero);

    secp256k1_scalar_set_b32(&k[0], &secnonce->data[4], NULL);
    secp256k1_scalar_set_b32(&k[1], &secnonce->data[36], NULL);
    secp256k1_ge_from_bytes(pk, &secnonce->data[68]);
    return 1;
}